

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseWaitStatement(Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  Token fork_00;
  Token wait_00;
  Token semi;
  Token openParen_00;
  Token closeParen_00;
  bool bVar1;
  long lVar2;
  StatementSyntax *label_00;
  Info *in_RSI;
  long in_RDI;
  Token TVar3;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  Token fork;
  Token wait;
  undefined1 in_stack_00000976;
  undefined1 in_stack_00000977;
  Parser *in_stack_00000978;
  Parser *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  TokenKind in_stack_fffffffffffffe4e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe50;
  ParserBase *in_stack_fffffffffffffe60;
  Info *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  Info *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  Info *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffec8;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffed0;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_10;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffec8 >> 0x30);
  ParserBase::consume(in_stack_fffffffffffffe60);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe50._M_extent_value,
                           in_stack_fffffffffffffe4e);
  if (bVar1) {
    TVar3 = ParserBase::consume(in_stack_fffffffffffffe60);
    elements._M_ptr._6_2_ = in_stack_fffffffffffffe4e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffe48;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe40,
               elements);
    local_50 = TVar3._0_8_;
    local_48 = TVar3.info;
    TVar3 = ParserBase::expect(in_stack_fffffffffffffed0,kind);
    fork_00.info = in_stack_fffffffffffffe68;
    fork_00._0_8_ = in_stack_fffffffffffffe60;
    semi.info = in_stack_fffffffffffffe78;
    semi.kind = (short)in_stack_fffffffffffffe70;
    semi._2_1_ = (char)((ulong)in_stack_fffffffffffffe70 >> 0x10);
    semi.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe70 >> 0x18);
    semi.rawLen = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    local_10 = (WaitStatementSyntax *)
               slang::syntax::SyntaxFactory::waitForkStatement
                         ((SyntaxFactory *)local_48,local_50,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x341890,TVar3,
                          fork_00,semi);
  }
  else {
    ParserBase::expect(in_stack_fffffffffffffed0,kind);
    parseExpression(in_stack_fffffffffffffe40);
    TVar3 = ParserBase::expect(in_stack_fffffffffffffed0,kind);
    lVar2 = in_RDI + 0xe0;
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffe4e;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffe48;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe40,
               elements_00);
    local_f0 = TVar3._0_8_;
    local_e8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar3.info;
    label_00 = parseStatement(in_stack_00000978,(bool)in_stack_00000977,(bool)in_stack_00000976);
    wait_00.info = in_RSI;
    wait_00.kind = (short)lVar2;
    wait_00._2_1_ = (char)((ulong)lVar2 >> 0x10);
    wait_00.numFlags.raw = (char)((ulong)lVar2 >> 0x18);
    wait_00.rawLen = (int)((ulong)lVar2 >> 0x20);
    openParen_00.info = in_stack_fffffffffffffe88;
    openParen_00.kind = (short)in_stack_fffffffffffffe80;
    openParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffe80 >> 0x10);
    openParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe80 >> 0x18);
    openParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    closeParen_00.info = local_f0;
    closeParen_00.kind = (short)in_RDI;
    closeParen_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    closeParen_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    closeParen_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    local_10 = slang::syntax::SyntaxFactory::waitStatement
                         ((SyntaxFactory *)in_stack_fffffffffffffe60,(NamedLabelSyntax *)label_00,
                          local_e8,wait_00,openParen_00,(ExpressionSyntax *)local_f0,closeParen_00,
                          (StatementSyntax *)local_e8);
  }
  return &local_10->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseWaitStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto wait = consume();
    if (peek(TokenKind::ForkKeyword)) {
        auto fork = consume();
        return factory.waitForkStatement(label, attributes, wait, fork,
                                         expect(TokenKind::Semicolon));
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    return factory.waitStatement(label, attributes, wait, openParen, expr, closeParen,
                                 parseStatement());
}